

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void baryonyx::itm::
     init_with_pre_solve<baryonyx::itm::default_cost_type<double>,baryonyx::itm::maximize_tag>
               (bit_array *x_pessimistic,bit_array *x_optimistic,random_engine *rng,
               default_cost_type<double> *c,
               vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *constraints,double init_random)

{
  pointer pmVar1;
  pointer pfVar2;
  bool bVar3;
  byte bVar4;
  undefined1 auVar5 [16];
  pointer prVar6;
  pointer prVar7;
  bit_array_impl *pbVar8;
  random_engine *prVar9;
  pointer pmVar10;
  ulong uVar11;
  int *piVar12;
  long unaff_RBX;
  merged_constraint *cst;
  int iVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  size_type __n;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  ulong uVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar24 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar36 [64];
  double dVar37;
  vector<reduced_cost,_std::allocator<reduced_cost>_> R;
  allocator_type local_79;
  ulong local_78;
  vector<reduced_cost,_std::allocator<reduced_cost>_> local_70;
  bit_array_impl *local_58;
  random_engine *local_50;
  default_cost_type<double> *local_48;
  pointer local_40;
  double local_38;
  undefined1 auVar25 [32];
  undefined1 auVar35 [64];
  
  pmVar10 = (constraints->
            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pmVar1 = (constraints->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pmVar10 == pmVar1) {
    __n = 0;
  }
  else {
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxwd_avx2(_DAT_00623e90);
    lVar15 = -0x28 - (long)pmVar10;
    uVar11 = 0;
    auVar29 = vpbroadcastq_avx512f();
    auVar30 = vpsrlq_avx512f(auVar29,5);
    auVar29 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar33 = auVar29;
      auVar29 = vpbroadcastq_avx512f();
      uVar11 = uVar11 + 8;
      auVar29 = vporq_avx512f(auVar29,auVar28);
      uVar21 = vpcmpuq_avx512f(auVar29,auVar30,2);
      auVar29 = vpgatherdq_avx512f(*(undefined4 *)
                                    ((long)&(pmVar10->elements).
                                            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                            ._M_impl.super__Vector_impl_data._M_finish + unaff_RBX))
      ;
      bVar4 = (byte)uVar21;
      auVar31._8_8_ = (ulong)((byte)(uVar21 >> 1) & 1) * auVar29._8_8_;
      auVar31._0_8_ = (ulong)(bVar4 & 1) * auVar29._0_8_;
      auVar31._16_8_ = (ulong)((byte)(uVar21 >> 2) & 1) * auVar29._16_8_;
      auVar31._24_8_ = (ulong)((byte)(uVar21 >> 3) & 1) * auVar29._24_8_;
      auVar31._32_8_ = (ulong)((byte)(uVar21 >> 4) & 1) * auVar29._32_8_;
      auVar31._40_8_ = (ulong)((byte)(uVar21 >> 5) & 1) * auVar29._40_8_;
      auVar31._48_8_ = (ulong)((byte)(uVar21 >> 6) & 1) * auVar29._48_8_;
      auVar31._56_8_ = (uVar21 >> 7) * auVar29._56_8_;
      auVar29 = vpgatherdq_avx512f(*(undefined4 *)
                                    ((long)&(pmVar10->elements).
                                            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                            ._M_impl.super__Vector_impl_data._M_start + unaff_RBX));
      auVar32._8_8_ = (ulong)((byte)(uVar21 >> 1) & 1) * auVar29._8_8_;
      auVar32._0_8_ = (ulong)(bVar4 & 1) * auVar29._0_8_;
      auVar32._16_8_ = (ulong)((byte)(uVar21 >> 2) & 1) * auVar29._16_8_;
      auVar32._24_8_ = (ulong)((byte)(uVar21 >> 3) & 1) * auVar29._24_8_;
      auVar32._32_8_ = (ulong)((byte)(uVar21 >> 4) & 1) * auVar29._32_8_;
      auVar32._40_8_ = (ulong)((byte)(uVar21 >> 5) & 1) * auVar29._40_8_;
      auVar32._48_8_ = (ulong)((byte)(uVar21 >> 6) & 1) * auVar29._48_8_;
      auVar32._56_8_ = (uVar21 >> 7) * auVar29._56_8_;
      pmVar10 = pmVar10 + 8;
      auVar29 = vpsubq_avx512f(auVar31,auVar32);
      auVar29 = vpsrlq_avx512f(auVar29,3);
      auVar24 = vpmovqd_avx512f(auVar29);
      auVar24 = vpmaxsd_avx2(auVar33._0_32_,auVar24);
      auVar29 = ZEXT3264(auVar24);
    } while (((ulong)((long)pmVar1 + lVar15) / 0x28 + 8 & 0xfffffffffffffff8) != uVar11);
    auVar24 = vmovdqa32_avx512vl(auVar24);
    auVar23._0_4_ = (uint)(bVar4 & 1) * auVar24._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar33._0_4_;
    bVar3 = (bool)((byte)(uVar21 >> 1) & 1);
    auVar23._4_4_ = (uint)bVar3 * auVar24._4_4_ | (uint)!bVar3 * auVar33._4_4_;
    bVar3 = (bool)((byte)(uVar21 >> 2) & 1);
    auVar23._8_4_ = (uint)bVar3 * auVar24._8_4_ | (uint)!bVar3 * auVar33._8_4_;
    bVar3 = (bool)((byte)(uVar21 >> 3) & 1);
    auVar23._12_4_ = (uint)bVar3 * auVar24._12_4_ | (uint)!bVar3 * auVar33._12_4_;
    bVar3 = (bool)((byte)(uVar21 >> 4) & 1);
    auVar25._16_4_ = (uint)bVar3 * auVar24._16_4_ | (uint)!bVar3 * auVar33._16_4_;
    auVar25._0_16_ = auVar23;
    bVar3 = (bool)((byte)(uVar21 >> 5) & 1);
    auVar25._20_4_ = (uint)bVar3 * auVar24._20_4_ | (uint)!bVar3 * auVar33._20_4_;
    bVar3 = (bool)((byte)(uVar21 >> 6) & 1);
    auVar25._24_4_ = (uint)bVar3 * auVar24._24_4_ | (uint)!bVar3 * auVar33._24_4_;
    bVar3 = SUB81(uVar21 >> 7,0);
    auVar25._28_4_ = (uint)bVar3 * auVar24._28_4_ | (uint)!bVar3 * auVar33._28_4_;
    auVar23 = vpmaxsd_avx(auVar23,auVar25._16_16_);
    auVar5 = vpshufd_avx(auVar23,0xee);
    auVar23 = vpmaxsd_avx(auVar23,auVar5);
    auVar5 = vpshufd_avx(auVar23,0x55);
    auVar23 = vpmaxsd_avx(auVar23,auVar5);
    __n = CONCAT44((int)((ulong)x_optimistic >> 0x20),auVar23._0_4_);
  }
  local_58 = &x_pessimistic->super_bit_array_impl;
  local_48 = c;
  local_38 = init_random;
  std::vector<reduced_cost,_std::allocator<reduced_cost>_>::vector(&local_70,__n,&local_79);
  local_40 = (constraints->
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  pmVar10 = (constraints->
            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            )._M_impl.super__Vector_impl_data._M_start;
  prVar9 = rng;
  if (pmVar10 != local_40) {
    do {
      local_50 = prVar9;
      dVar37 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (rng);
      if (dVar37 < local_38) {
        std::vector<reduced_cost,_std::allocator<reduced_cost>_>::resize
                  (&local_70,
                   (long)(pmVar10->elements).
                         super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pmVar10->elements).
                         super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
        auVar29 = vpbroadcastq_avx512f(ZEXT816(0xc));
        auVar28 = vpbroadcastq_avx512f(ZEXT816(8));
        pfVar2 = (pmVar10->elements).
                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_78 = (ulong)((long)(pmVar10->elements).
                                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar2) >> 3;
        if ((int)local_78 != 0) {
          auVar30 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          uVar11 = (local_78 & 0xffffffff) + 7 & 0xfffffffffffffff8;
          auVar31 = vpbroadcastq_avx512f();
          auVar32 = vpbroadcastq_avx512f();
          do {
            uVar21 = vpcmpuq_avx512f(auVar30,auVar31,2);
            auVar33 = vpmullq_avx512dq(auVar30,auVar29);
            uVar11 = uVar11 - 8;
            auVar24 = vpgatherqd_avx512f(*(undefined8 *)
                                          &pfVar2[(long)local_70.
                                                  super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                                  ._M_impl.super__Vector_impl_data._M_start].
                                           variable_index);
            bVar4 = (byte)uVar21;
            auVar26._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar24._4_4_;
            auVar26._0_4_ = (uint)(bVar4 & 1) * auVar24._0_4_;
            auVar26._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar24._8_4_;
            auVar26._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar24._12_4_;
            auVar26._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar24._16_4_;
            auVar26._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar24._20_4_;
            auVar26._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar24._24_4_;
            auVar26._28_4_ = (uint)(byte)(uVar21 >> 7) * auVar24._28_4_;
            auVar34 = vpaddq_avx512f(auVar32,auVar33);
            auVar35 = vgatherdpd_avx512f(*(undefined4 *)
                                          ((local_48->linear_elements)._M_t.
                                           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                           .super__Head_base<0UL,_double_*,_false>._M_head_impl +
                                          (long)pmVar10));
            auVar36._8_8_ = (ulong)((byte)(uVar21 >> 1) & 1) * auVar35._8_8_;
            auVar36._0_8_ = (ulong)(bVar4 & 1) * auVar35._0_8_;
            auVar36._16_8_ = (ulong)((byte)(uVar21 >> 2) & 1) * auVar35._16_8_;
            auVar36._24_8_ = (ulong)((byte)(uVar21 >> 3) & 1) * auVar35._24_8_;
            auVar36._32_8_ = (ulong)((byte)(uVar21 >> 4) & 1) * auVar35._32_8_;
            auVar36._40_8_ = (ulong)((byte)(uVar21 >> 5) & 1) * auVar35._40_8_;
            auVar36._48_8_ = (ulong)((byte)(uVar21 >> 6) & 1) * auVar35._48_8_;
            auVar36._56_8_ = (uVar21 >> 7) * auVar35._56_8_;
            auVar24 = vcvtpd2ps_avx512f(auVar36);
            vscatterqps_avx512f(ZEXT864(local_70.
                                        super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                        ._M_impl.super__Vector_impl_data._M_start) + auVar33,uVar21,
                                auVar24);
            auVar24 = vpgatherqd_avx512f(pfVar2[(long)local_70.
                                                  super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                                  ._M_impl.super__Vector_impl_data._M_start]);
            auVar27._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar24._4_4_;
            auVar27._0_4_ = (uint)(bVar4 & 1) * auVar24._0_4_;
            auVar27._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar24._8_4_;
            auVar27._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar24._12_4_;
            auVar27._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar24._16_4_;
            auVar27._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar24._20_4_;
            auVar27._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar24._24_4_;
            auVar27._28_4_ = (uint)(byte)(uVar21 >> 7) * auVar24._28_4_;
            auVar30 = vpaddq_avx512f(auVar30,auVar28);
            vpscatterqd_avx512f(ZEXT832(4) + auVar34._0_32_,uVar21,auVar27);
            vpscatterqd_avx512f(ZEXT832(8) + auVar34._0_32_,uVar21,auVar26);
          } while (uVar11 != 0);
        }
        std::
        shuffle<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  ((__normal_iterator<reduced_cost_*,_std::vector<reduced_cost,_std::allocator<reduced_cost>_>_>
                    )local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<reduced_cost_*,_std::vector<reduced_cost,_std::allocator<reduced_cost>_>_>
                    )local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_finish,rng);
        prVar7 = local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        prVar6 = local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (int)LZCOUNT(((long)local_70.
                                         super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_70.
                                         super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 2) *
                                  -0x5555555555555555) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar6,prVar7);
        }
        pbVar8 = local_58;
        if ((local_58->m_data)._M_t.
            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
          uVar20 = (uint)local_78;
          if (-1 < (int)uVar20) {
            uVar11 = 0;
            iVar18 = 0;
            piVar12 = &(local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                        _M_impl.super__Vector_impl_data._M_start)->factor;
LAB_0016f21a:
            if ((iVar18 < pmVar10->min) || (pmVar10->max < iVar18)) goto LAB_0016f224;
            if (-1 < (long)(uVar11 - 1)) {
              lVar15 = 8;
              uVar21 = uVar11;
              do {
                bit_array_impl::set(pbVar8,*(int *)((long)&(local_70.
                                                  super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->value
                                                  + lVar15));
                lVar15 = lVar15 + 0xc;
                uVar21 = uVar21 - 1;
              } while (uVar21 != 0);
              uVar20 = (uint)local_78;
              goto LAB_0016f272;
            }
          }
LAB_0016f26f:
          uVar11 = 0;
LAB_0016f272:
          pbVar8 = local_58;
          if ((uint)uVar11 != uVar20) {
            lVar15 = (uVar11 & 0xffffffff) * 0xc + 8;
            lVar22 = (uVar11 & 0xffffffff) - (local_78 & 0xffffffff);
            do {
              bit_array_impl::unset
                        (pbVar8,*(int *)((long)&(local_70.
                                                 super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->value +
                                        lVar15));
              lVar15 = lVar15 + 0xc;
              lVar22 = lVar22 + 1;
            } while (lVar22 != 0);
          }
        }
        uVar11 = local_78;
        rng = local_50;
        if ((x_optimistic->super_bit_array_impl).m_data._M_t.
            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
          uVar20 = (uint)local_78;
          if ((int)uVar20 < 0) {
LAB_0016f360:
            uVar14 = 0;
          }
          else {
            uVar17 = (ulong)(uVar20 & 0x7fffffff);
            uVar19 = 0xffffffffffffffff;
            iVar18 = 0;
            piVar12 = &(local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                        _M_impl.super__Vector_impl_data._M_start)->factor;
            uVar21 = 0xfffffffe;
            do {
              uVar16 = uVar19 & 0xffffffff;
              if (pmVar10->max < iVar18) {
                uVar16 = uVar21;
              }
              if (iVar18 < pmVar10->min) {
                uVar16 = uVar21;
              }
              uVar19 = uVar19 + 1;
              iVar13 = (int)uVar16;
              if (((iVar13 != -2) && ((long)uVar19 < (long)uVar17)) &&
                 (((reduced_cost *)(piVar12 + -1))->value < 0.0)) break;
              if ((long)uVar19 < (long)uVar17) {
                iVar18 = iVar18 + *piVar12;
              }
              piVar12 = piVar12 + 3;
              uVar21 = uVar16;
            } while (uVar17 != uVar19);
            if (iVar13 < 0) goto LAB_0016f360;
            uVar14 = iVar13 + 1;
            lVar15 = 0;
            do {
              bit_array_impl::set(&x_optimistic->super_bit_array_impl,
                                  *(int *)((long)&(local_70.
                                                  super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id +
                                          lVar15));
              lVar15 = lVar15 + 0xc;
            } while (uVar16 * 0xc + 0xc != lVar15);
          }
          rng = local_50;
          if (uVar14 != uVar20) {
            lVar22 = (ulong)uVar14 - (uVar11 & 0xffffffff);
            lVar15 = (ulong)uVar14 * 0xc + 8;
            do {
              bit_array_impl::unset
                        (&x_optimistic->super_bit_array_impl,
                         *(int *)((long)&(local_70.
                                          super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->value + lVar15
                                 ));
              lVar15 = lVar15 + 0xc;
              lVar22 = lVar22 + 1;
            } while (lVar22 != 0);
          }
        }
      }
      pmVar10 = pmVar10 + 1;
      prVar9 = local_50;
    } while (pmVar10 != local_40);
  }
  if (local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
      super__Vector_impl_data._M_start != (reduced_cost *)0x0) {
    operator_delete(local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
LAB_0016f224:
  if ((long)uVar11 < (long)(ulong)(uVar20 & 0x7fffffff)) {
    iVar18 = iVar18 + *piVar12;
  }
  uVar11 = uVar11 + 1;
  piVar12 = piVar12 + 3;
  if ((ulong)(uVar20 & 0x7fffffff) + 1 == uVar11) goto LAB_0016f26f;
  goto LAB_0016f21a;
}

Assistant:

void
init_with_pre_solve(bit_array& x_pessimistic,
                    bit_array& x_optimistic,
                    random_engine& rng,
                    const Cost& c,
                    const std::vector<merged_constraint>& constraints,
                    const double init_random) noexcept
{
    int max_length = 0;
    for (const auto& cst : constraints)
        if (length(cst.elements) > max_length)
            max_length = length(cst.elements);

    struct reduced_cost
    {
        float value;
        int factor;
        int id;
    };

    std::vector<reduced_cost> R(max_length);
    std::bernoulli_distribution dist(init_random);

    for (const auto& cst : constraints) {
        if (!dist(rng))
            continue;

        R.resize(cst.elements.size());
        const int r_size = length(cst.elements);

        for (int i = 0; i != r_size; ++i) {
            R[i].value = static_cast<float>(c[cst.elements[i].variable_index]);
            R[i].factor = cst.elements[i].factor;
            R[i].id = cst.elements[i].variable_index;
        }

        std::shuffle(std::begin(R), std::end(R), rng);
        std::sort(
          std::begin(R), std::end(R), [](const auto& lhs, const auto& rhs) {
              return is_better_solution<Mode>(lhs.value, rhs.value);
          });

        if (!x_pessimistic.empty()) {
            int sum = 0;
            int best = -2;

            for (int i = -1; i < r_size; ++i) {
                if (cst.min <= sum && sum <= cst.max) {
                    best = i;
                    break;
                }

                if (i + 1 < r_size)
                    sum += R[i + 1].factor;
            }

            int i = 0;
            for (; i <= best; ++i)
                x_pessimistic.set(R[i].id);

            for (; i != r_size; ++i) {
                x_pessimistic.unset(R[i].id);
            }
        }

        if (!x_optimistic.empty()) {
            int sum = 0;
            int best = -2;

            for (int i = -1; i < r_size; ++i) {
                if (cst.min <= sum && sum <= cst.max)
                    best = i;

                if (best != -2 && i + 1 < r_size &&
                    stop_iterating<Mode>(R[i + 1].value))
                    break;

                if (i + 1 < r_size)
                    sum += R[i + 1].factor;
            }

            int i = 0;
            for (; i <= best; ++i)
                x_optimistic.set(R[i].id);

            for (; i != r_size; ++i)
                x_optimistic.unset(R[i].id);
        }
    }
}